

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit
          (CodeGenerateVisitor *this,AssignmentStatement *assign_stmt,void *data)

{
  bool bVar1;
  char *module;
  Function *this_00;
  String *this_01;
  char (*args) [36];
  pointer pSVar2;
  long in_RSI;
  CodeGenerateVisitor *in_RDI;
  VarListData_conflict var_list_data;
  CodeGenerateException *anon_var_2;
  ExpListData_conflict exp_list_data;
  int end_register;
  int register_id;
  Guard g;
  int r;
  Guard *in_stack_fffffffffffffee0;
  anon_class_16_2_fd512ddf *in_stack_fffffffffffffee8;
  function<void_()> *in_stack_fffffffffffffef0;
  function<void_()> *in_stack_fffffffffffffef8;
  Guard *in_stack_ffffffffffffff00;
  VarListData local_c8 [2];
  ExpListData local_b4 [2];
  int local_ac;
  int local_a8;
  int local_90;
  int local_1c;
  long local_10;
  
  local_10 = in_RSI;
  local_1c = GetNextRegisterId(in_RDI);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::AssignmentStatement*,void*)::__0,void>
            (in_stack_fffffffffffffef0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffee8);
  local_90 = local_1c;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::AssignmentStatement*,void*)::__1,void>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Guard::Guard(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::function<void_()>::~function((function<void_()> *)0x20abbd);
  std::function<void_()>::~function((function<void_()> *)0x20abca);
  local_a8 = GetNextRegisterId(in_RDI);
  local_ac = local_a8 + *(int *)(local_10 + 0x20);
  ResetRegisterIdGenerator(in_RDI,local_ac);
  bVar1 = IsRegisterCountOverflow(in_RDI);
  if (!bVar1) {
    ExpListData::ExpListData(local_b4,local_a8,local_ac);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x20ad43);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_b4);
    VarListData::VarListData(local_c8,local_a8,local_ac);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x20ae7f);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_c8);
    Guard::~Guard(in_stack_fffffffffffffee0);
    return;
  }
  module = (char *)__cxa_allocate_exception(0x20);
  this_00 = GetCurrentFunction(in_RDI);
  this_01 = Function::GetModule(this_00);
  args = (char (*) [36])String::GetCStr(this_01);
  CodeGenerateException::CodeGenerateException<char_const(&)[36]>
            ((CodeGenerateException *)this_00,module,(int)((ulong)this_01 >> 0x20),args);
  __cxa_throw(module,&CodeGenerateException::typeinfo,CodeGenerateException::~CodeGenerateException)
  ;
}

Assistant:

void CodeGenerateVisitor::Visit(AssignmentStatement *assign_stmt, void *data)
    {
        REGISTER_GENERATOR_GUARD();

        // Reserve registers for var list
        int register_id = GetNextRegisterId();
        int end_register = register_id + assign_stmt->var_count_;
        ResetRegisterIdGenerator(end_register);
        if (IsRegisterCountOverflow())
        {
            throw CodeGenerateException(
                GetCurrentFunction()->GetModule()->GetCStr(),
                assign_stmt->line_,
                "assignment statement is too complex");
        }

        try
        {
            // Get exp list results placed into [register_id, end_register)
            ExpListData exp_list_data{ register_id, end_register };
            assign_stmt->exp_list_->Accept(this, &exp_list_data);
        }
        catch (const CodeGenerateException &)
        {
            // Exp list consume some registers, and register count overflow,
            // catch it, throw new exception to report assignment statement
            // is too complex
            throw CodeGenerateException(
                GetCurrentFunction()->GetModule()->GetCStr(),
                assign_stmt->line_,
                "assignment statement is too complex");
        }

        // Assign results to var list
        VarListData var_list_data{ register_id, end_register };
        assign_stmt->var_list_->Accept(this, &var_list_data);
    }